

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O1

Vec_Wec_t * Gia_Iso4Gia(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  Vec_Wec_t *pVVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int RandC [2];
  uint local_40 [2];
  Vec_Wec_t *local_38;
  
  pVVar8 = Gia_ManLevelizeR(p);
  Abc_Random(1);
  local_38 = pVVar8;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      pVVar3 = local_38->pArray;
      local_40[0] = Abc_Random(0);
      local_40[1] = Abc_Random(0);
      uVar7 = pVVar3[lVar11].nSize;
      if (lVar11 == 0) {
        if (0 < (int)uVar7) {
          lVar10 = 0;
          do {
            iVar2 = pVVar3->pArray[lVar10];
            if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_007561cc;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar1 = p->pObjs + iVar2;
            if ((-1 < (int)(uint)*(ulong *)pGVar1) ||
               (((uint)*(ulong *)pGVar1 & 0x1fffffff) == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsCo(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso3.c"
                            ,0xb9,"Vec_Wec_t *Gia_Iso4Gia(Gia_Man_t *)");
            }
            uVar7 = Abc_Random(0);
            pGVar1->Value = uVar7;
            pGVar1[-(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff)].Value =
                 pGVar1[-(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff)].Value +
                 uVar7 + *(int *)((long)local_40 + (ulong)((uint)(*(ulong *)pGVar1 >> 0x1b) & 4));
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar3->nSize);
        }
      }
      else if (0 < (int)uVar7) {
        piVar4 = pVVar3[lVar11].pArray;
        uVar9 = 0;
        do {
          iVar2 = piVar4[uVar9];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_007561cc:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar1 = p->pObjs + iVar2;
          uVar5 = *(ulong *)pGVar1;
          if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar5) {
            pGVar1[-(uVar5 & 0x1fffffff)].Value =
                 pGVar1[-(uVar5 & 0x1fffffff)].Value +
                 *(int *)((long)local_40 + (ulong)((uint)(uVar5 >> 0x1b) & 4)) + pGVar1->Value;
            uVar6 = (uint)(uVar5 >> 0x20);
            pGVar1[-(ulong)(uVar6 & 0x1fffffff)].Value =
                 pGVar1[-(ulong)(uVar6 & 0x1fffffff)].Value +
                 local_40[uVar6 >> 0x1d & 1] + pGVar1->Value;
          }
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < local_38->nSize);
  }
  return local_38;
}

Assistant:

Vec_Wec_t * Gia_Iso4Gia( Gia_Man_t * p )
{
    Vec_Wec_t * vLevs = Gia_ManLevelizeR( p );
    Vec_Int_t * vLevel; int l;
    Abc_Random( 1 );
    Vec_WecForEachLevel( vLevs, vLevel, l )
    {
        Gia_Obj_t * pObj;  int i;
        int RandC[2] = { Abc_Random(0), Abc_Random(0) };
        if ( l == 0 )
        {
            Gia_ManForEachObjVec( vLevel, p, pObj, i )
            {
                assert( Gia_ObjIsCo(pObj) );
                pObj->Value = Abc_Random(0);
                Gia_ObjFanin0(pObj)->Value += pObj->Value + RandC[Gia_ObjFaninC0(pObj)];
            }
        }
        else 
        {
            Gia_ManForEachObjVec( vLevel, p, pObj, i ) if ( Gia_ObjIsAnd(pObj) )
            {
                Gia_ObjFanin0(pObj)->Value += pObj->Value + RandC[Gia_ObjFaninC0(pObj)];
                Gia_ObjFanin1(pObj)->Value += pObj->Value + RandC[Gia_ObjFaninC1(pObj)];
            }
        }
    }
    return vLevs;
}